

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dunk.c
# Opt level: O1

void envy_bios_print_spreadspectrum(envy_bios *bios,FILE *out,uint mask)

{
  byte bVar1;
  ushort uVar2;
  envy_bios_spreadspectrum_entry *peVar3;
  uint uVar4;
  size_t sVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar2 = (bios->spreadspectrum).offset;
  if ((mask >> 0x16 & 1) == 0 || uVar2 == 0) {
    return;
  }
  bVar1 = (bios->spreadspectrum).version;
  uVar8 = (ulong)(bVar1 >> 4);
  uVar7 = (ulong)(bVar1 & 0xf);
  if ((bios->spreadspectrum).valid != '\0') {
    fprintf((FILE *)out,"SPREADSPECTRUM table at 0x%04x version %d.%d",(ulong)uVar2,uVar8,uVar7);
    uVar8 = (ulong)(bios->spreadspectrum).unk04;
    if ((bios->spreadspectrum).version < 0x41) {
      fprintf((FILE *)out," unk04 0x%02x 0x%02x 0x%02x 0x%02x 0x%02x 0x%02x\n",uVar8,
              (ulong)(bios->spreadspectrum).unk05,(ulong)(bios->spreadspectrum).unk06,
              (ulong)(bios->spreadspectrum).unk07,(ulong)(bios->spreadspectrum).unk08,
              (ulong)(bios->spreadspectrum).unk09);
    }
    else {
      fprintf((FILE *)out," unk04 0x%02x\n",uVar8);
    }
    envy_bios_dump_hex(bios,out,(uint)(bios->spreadspectrum).offset,
                       (uint)(bios->spreadspectrum).hlen,mask);
    if ((bios->spreadspectrum).entriesnum != '\0') {
      uVar8 = 0;
      do {
        peVar3 = (bios->spreadspectrum).entries;
        envy_bios_dump_hex(bios,out,(uint)peVar3[uVar8].offset,(uint)(bios->spreadspectrum).rlen,
                           mask);
        if ((peVar3[uVar8].unk00 & 1) == 0) {
          fprintf((FILE *)out,"SPREADSPECTRUM %d: INVALID 0x%02x",uVar8 & 0xffffffff);
          if (1 < (bios->spreadspectrum).rlen) {
            fprintf((FILE *)out," 0x%02x",(ulong)peVar3[uVar8].unk01);
          }
        }
        else {
          fprintf((FILE *)out,"SPREADSPECTRUM %d: ",uVar8 & 0xffffffff);
          fprintf((FILE *)out,"idx(%1x) ",(ulong)(peVar3[uVar8].unk00 >> 4 & 1));
          switch(peVar3[uVar8].unk00 & 6) {
          case 0:
            sVar5 = 0xf;
            pcVar6 = "SRC_INTERNAL_0 ";
            break;
          case 2:
            sVar5 = 0xf;
            pcVar6 = "SRC_INTERNAL_1 ";
            break;
          case 4:
            sVar5 = 0xd;
            pcVar6 = "SRC_EXTERNAL ";
            break;
          case 6:
            sVar5 = 8;
            pcVar6 = "SRC_PLL ";
          }
          fwrite(pcVar6,sVar5,1,(FILE *)out);
          uVar4 = peVar3[uVar8].unk01 & 0x3f;
          fprintf((FILE *)out,"SPREAD(%d.%02d%%) ",(ulong)uVar4 / 0x14,(ulong)((uVar4 * 5) % 100));
          if ((peVar3[uVar8].unk01 & 0x70) == 0) {
            sVar5 = 6;
            pcVar6 = "CENTER";
          }
          else {
            sVar5 = 4;
            pcVar6 = "DOWN";
          }
          fwrite(pcVar6,sVar5,1,(FILE *)out);
        }
        fputc(10,(FILE *)out);
        uVar8 = uVar8 + 1;
      } while (uVar8 < (bios->spreadspectrum).entriesnum);
    }
    fputc(10,(FILE *)out);
    return;
  }
  fprintf((FILE *)out,"Failed to parse SPREADSPECTRUM table at 0x%04x version %d.%d\n\n",
          (ulong)uVar2,uVar8,uVar7);
  return;
}

Assistant:

void envy_bios_print_spreadspectrum (struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_spreadspectrum *spreadspectrum = &bios->spreadspectrum;
	if (!spreadspectrum->offset || !(mask & ENVY_BIOS_PRINT_DUNK))
		return;
	if (!spreadspectrum->valid) {
		fprintf(out, "Failed to parse SPREADSPECTRUM table at 0x%04x version %d.%d\n\n", spreadspectrum->offset, spreadspectrum->version >> 4, spreadspectrum->version & 0xf);
		return;
	}
	fprintf(out, "SPREADSPECTRUM table at 0x%04x version %d.%d", spreadspectrum->offset, spreadspectrum->version >> 4, spreadspectrum->version & 0xf);
	if (spreadspectrum->version < 0x41) {
		fprintf (out, " unk04 0x%02x 0x%02x 0x%02x 0x%02x 0x%02x 0x%02x\n", spreadspectrum->unk04, spreadspectrum->unk05, spreadspectrum->unk06, spreadspectrum->unk07, spreadspectrum->unk08, spreadspectrum->unk09);
	} else {
		fprintf (out, " unk04 0x%02x\n", spreadspectrum->unk04);
	}
	envy_bios_dump_hex(bios, out, spreadspectrum->offset, spreadspectrum->hlen, mask);
	int i;
	for (i = 0; i < spreadspectrum->entriesnum; i++) {
		unsigned int spread;
		struct envy_bios_spreadspectrum_entry *entry = &spreadspectrum->entries[i];
		envy_bios_dump_hex(bios, out, entry->offset, spreadspectrum->rlen, mask);
		if(!(entry->unk00 & 0x1)) {
			fprintf(out, "SPREADSPECTRUM %d: INVALID 0x%02x", i, entry->unk00);
						
			if (spreadspectrum->rlen >= 2)
				fprintf(out, " 0x%02x", entry->unk01);
		} else {
			fprintf(out, "SPREADSPECTRUM %d: ", i);
			fprintf(out, "idx(%1x) ", (entry->unk00 & 0x10) >> 4);
			switch(entry->unk00 & 0x6) {
			case 0x0:
				fprintf(out, "SRC_INTERNAL_0 ");
				break;
			case 0x2:
				fprintf(out, "SRC_INTERNAL_1 ");
				break;
			case 0x4:
				fprintf(out, "SRC_EXTERNAL ");
				break;
			case 0x6:
				fprintf(out, "SRC_PLL ");
				break;
			}
			spread = (entry->unk01 & 0x3f) * 5;
			fprintf(out, "SPREAD(%d.%02d%%) ", spread / 100, spread % 100);
			
			if(entry->unk01 & 0x70)
				fprintf(out, "DOWN");
			else
				fprintf(out, "CENTER");
		}
		fprintf(out, "\n");
	}
	fprintf(out, "\n");
}